

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
nlohmann::detail::
json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::~json_sax_dom_callback_parser
          (json_sax_dom_callback_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *this)

{
  _Manager_type p_Var1;
  pointer ppbVar2;
  
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&this->discarded);
  p_Var1 = (this->callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->callback,(_Any_data *)&this->callback,__destroy_functor);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->key_keep_stack).super__Bvector_base<std::allocator<bool>_>);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->keep_stack).super__Bvector_base<std::allocator<bool>_>);
  ppbVar2 = (this->ref_stack).
            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppbVar2 != (pointer)0x0) {
    operator_delete(ppbVar2);
    return;
  }
  return;
}

Assistant:

~json_sax_dom_callback_parser() = default;